

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

int64_t __thiscall minja::Value::to_int(Value *this)

{
  value_t vVar1;
  int iVar2;
  _Alloc_hider __nptr;
  bool bVar3;
  int *piVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *local_30;
  
  vVar1 = (this->primitive_).m_data.m_type;
  if (((((this->object_).
         super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr != (element_type *)0x0) ||
       ((this->array_).
        super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0)) || (vVar1 != null)) ||
     ((this->callable_).
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0)) {
    if (vVar1 == boolean) {
      bVar3 = get<bool>(this);
      return (ulong)bVar3;
    }
    if ((byte)(vVar1 - number_integer) < 3) {
      dVar6 = get<double>(this);
      return (long)dVar6;
    }
    if (vVar1 == string) {
      get<std::__cxx11::string>(&local_50,this);
      __nptr._M_p = local_50._M_dataplus._M_p;
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      *piVar4 = 0;
      lVar5 = strtol(__nptr._M_p,&local_30,10);
      if (local_30 != __nptr._M_p) {
        if (*piVar4 == 0) {
          *piVar4 = iVar2;
        }
        else if (*piVar4 == 0x22) {
          std::__throw_out_of_range("stol");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return lVar5;
        }
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        return lVar5;
      }
      auVar7 = std::__throw_invalid_argument("stol");
      if (auVar7._8_4_ != 1) {
        _Unwind_Resume(auVar7._0_8_);
      }
      __cxa_begin_catch();
      __cxa_end_catch();
    }
  }
  return 0;
}

Assistant:

int64_t to_int() const {
    if (is_null()) return 0;
    if (is_boolean()) return get<bool>() ? 1 : 0;
    if (is_number()) return static_cast<int64_t>(get<double>());
    if (is_string()) {
      try {
        return std::stol(get<std::string>());
      } catch (const std::exception &) {
        return 0;
      }
    }
    return 0;
  }